

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_iq3_xxs(block_iq3_xxs *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int l;
  long lVar10;
  uint8_t *puVar11;
  int ib32;
  long lVar12;
  float fVar13;
  float fVar14;
  
  lVar9 = 0;
  lVar7 = k / 0x100;
  if (k / 0x100 < 1) {
    lVar7 = lVar9;
  }
  for (; lVar9 != lVar7; lVar9 = lVar9 + 1) {
    puVar11 = x[lVar9].qs;
    fVar1 = ggml_table_f32_f16[x[lVar9].d];
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
      uVar6 = *(uint *)(x[lVar9].qs + lVar12 * 4 + 0x40);
      fVar13 = ((float)(uVar6 >> 0x1c) + 0.5) * fVar1 * 0.5;
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        bVar2 = ""[uVar6 >> ((char)lVar10 * '\a' & 0x1fU) & 0x7f];
        bVar3 = puVar11[lVar10 * 2];
        bVar4 = puVar11[lVar10 * 2 + 1];
        for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
          fVar14 = (float)*(byte *)((long)iq3xxs_grid + lVar8 + (ulong)bVar3 * 4) * fVar13;
          if ((kmask_iq2xs[lVar8] & bVar2) != 0) {
            fVar14 = -fVar14;
          }
          bVar5 = *(byte *)((long)iq3xxs_grid + lVar8 + (ulong)bVar4 * 4);
          y[lVar8] = fVar14;
          fVar14 = (float)bVar5 * fVar13;
          if ((kmask_iq2xs[lVar8 + 4] & bVar2) != 0) {
            fVar14 = -fVar14;
          }
          y[lVar8 + 4] = fVar14;
        }
        y = y + 8;
      }
      puVar11 = puVar11 + 8;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq3_xxs(const block_iq3_xxs * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    uint32_t aux32;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);
        const uint8_t * qs = x[i].qs;
        const uint8_t * scales_and_signs = qs + QK_K/4;

        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            memcpy(&aux32, scales_and_signs + 4*ib32, sizeof(uint32_t));
            const float db = d * (0.5f + (aux32 >> 28)) * 0.5f;
            for (int l = 0; l < 4; ++l) {
                const uint8_t  signs = ksigns_iq2xs[(aux32 >> 7*l) & 127];
                const uint8_t * grid1 = (const uint8_t *)(iq3xxs_grid + qs[2*l+0]);
                const uint8_t * grid2 = (const uint8_t *)(iq3xxs_grid + qs[2*l+1]);
                for (int j = 0; j < 4; ++j) {
                    y[j+0] = db * grid1[j] * (signs & kmask_iq2xs[j+0] ? -1.f : 1.f);
                    y[j+4] = db * grid2[j] * (signs & kmask_iq2xs[j+4] ? -1.f : 1.f);
                }
                y += 8;
            }
            qs += 8;
        }
    }
}